

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O0

Vec_Str_t *
Abc_NtkClpGiaOne2(Cnf_Dat_t *pCnf,Gia_Man_t *p,int iCo,int nCubeLim,int nBTLimit,int fCanon,
                 int fReverse,Vec_Int_t *vSupp,Vec_Int_t *vMap,int fVerbose,Vec_Int_t *vClass,
                 Vec_Wec_t *vSupps)

{
  sat_solver *pSat_00;
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pObj_00;
  Vec_Int_t *vNodes;
  Vec_Int_t *p_00;
  abctime aVar6;
  bool bVar7;
  Vec_Int_t *vSuppObjs;
  Vec_Int_t *vAnds;
  int iCoObjId;
  int i;
  abctime clk;
  Gia_Obj_t *pObj;
  sat_solver *pSat3;
  sat_solver *pSat2;
  sat_solver *pSat1;
  sat_solver *pSat;
  Vec_Str_t *vSop;
  int fCanon_local;
  int nBTLimit_local;
  int nCubeLim_local;
  int iCo_local;
  Gia_Man_t *p_local;
  Cnf_Dat_t *pCnf_local;
  
  pSat2 = (sat_solver *)0x0;
  pSat3 = (sat_solver *)0x0;
  pObj = (Gia_Obj_t *)0x0;
  vSop._0_4_ = fCanon;
  vSop._4_4_ = nBTLimit;
  fCanon_local = nCubeLim;
  nBTLimit_local = iCo;
  _nCubeLim_local = p;
  p_local = (Gia_Man_t *)pCnf;
  _iCoObjId = Abc_Clock();
  pGVar1 = _nCubeLim_local;
  pObj_00 = Gia_ManCo(_nCubeLim_local,nBTLimit_local);
  vAnds._0_4_ = Gia_ObjId(pGVar1,pObj_00);
  vNodes = Vec_IntAlloc(100);
  p_00 = Vec_IntAlloc(100);
  vAnds._4_4_ = 0;
  while( true ) {
    iVar3 = vAnds._4_4_;
    iVar2 = Vec_IntSize(vSupp);
    pGVar1 = _nCubeLim_local;
    bVar7 = false;
    if (iVar3 < iVar2) {
      iVar3 = Vec_IntEntry(vSupp,vAnds._4_4_);
      clk = (abctime)Gia_ManCi(pGVar1,iVar3);
      bVar7 = (Gia_Obj_t *)clk != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar3 = Gia_ObjId(_nCubeLim_local,(Gia_Obj_t *)clk);
    Vec_IntPush(p_00,iVar3);
    vAnds._4_4_ = vAnds._4_4_ + 1;
  }
  Gia_ManIncrementTravId(_nCubeLim_local);
  Gia_ManCollectAnds(_nCubeLim_local,(int *)&vAnds,1,vNodes,(Vec_Int_t *)0x0);
  iVar3 = Vec_IntSize(vNodes);
  if (iVar3 < 1) {
    __assert_fail("Vec_IntSize(vAnds) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCollapse.c"
                  ,0x2fb,
                  "Vec_Str_t *Abc_NtkClpGiaOne2(Cnf_Dat_t *, Gia_Man_t *, int, int, int, int, int, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Wec_t *)"
                 );
  }
  pSat1 = Abc_NtkClpDeriveSatSolver
                    ((Cnf_Dat_t *)p_local,(int)vAnds,p_00,vNodes,vMap,(sat_solver **)0x0,
                     (sat_solver **)0x0,(sat_solver **)0x0);
  Vec_IntFree(p_00);
  iVar3 = nBTLimit_local;
  if (fVerbose != 0) {
    uVar4 = Vec_IntSize(vSupp);
    uVar5 = Vec_IntSize(vNodes);
    printf("Output %4d:  Supp = %4d. Cone =%6d.\n",(ulong)(uint)iVar3,(ulong)uVar4,(ulong)uVar5);
  }
  pSat_00 = pSat1;
  iVar3 = Vec_IntSize(vSupp);
  pSat = (sat_solver *)
         Bmc_CollapseOne_int(pSat_00,iVar3,fCanon_local,vSop._4_4_,(int)vSop,fReverse,fVerbose);
  sat_solver_delete(pSat1);
  if (pSat2 != (sat_solver *)0x0) {
    sat_solver_delete(pSat2);
  }
  if (pSat3 != (sat_solver *)0x0) {
    sat_solver_delete(pSat3);
  }
  if (pObj != (Gia_Obj_t *)0x0) {
    sat_solver_delete((sat_solver *)pObj);
  }
  Vec_IntFree(vNodes);
  if (pSat == (sat_solver *)0x0) {
    pCnf_local = (Cnf_Dat_t *)0x0;
  }
  else {
    Abc_NtkCollapseReduce((Vec_Str_t *)pSat,vSupp,vClass,vSupps);
    if (fVerbose != 0) {
      uVar4 = Vec_IntSize(vSupp);
      iVar3 = Vec_StrSize((Vec_Str_t *)pSat);
      iVar2 = Vec_IntSize(vSupp);
      printf("Supp new = %4d. Sop = %4d.  ",(ulong)uVar4,
             (long)iVar3 / (long)(iVar2 + 3) & 0xffffffff);
      aVar6 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar6 - _iCoObjId);
    }
    pCnf_local = (Cnf_Dat_t *)pSat;
  }
  return (Vec_Str_t *)pCnf_local;
}

Assistant:

Vec_Str_t * Abc_NtkClpGiaOne2( Cnf_Dat_t * pCnf, Gia_Man_t * p, int iCo, int nCubeLim, int nBTLimit, int fCanon, int fReverse, Vec_Int_t * vSupp, Vec_Int_t * vMap, int fVerbose, Vec_Int_t * vClass, Vec_Wec_t * vSupps )
{
    Vec_Str_t * vSop;
    sat_solver * pSat, * pSat1 = NULL, * pSat2 = NULL, * pSat3 = NULL;
    Gia_Obj_t * pObj;
    abctime clk = Abc_Clock();
    extern Vec_Str_t * Bmc_CollapseOne_int( sat_solver * pSat, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    extern Vec_Str_t * Bmc_CollapseOne_int2( sat_solver * pSat, sat_solver * pSat2, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    extern Vec_Str_t * Bmc_CollapseOne_int3( sat_solver * pSat, sat_solver * pSat1, sat_solver * pSat2, sat_solver * pSat3, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    int i, iCoObjId = Gia_ObjId( p, Gia_ManCo(p, iCo) );
    Vec_Int_t * vAnds = Vec_IntAlloc( 100 );
    Vec_Int_t * vSuppObjs = Vec_IntAlloc( 100 );
    Gia_ManForEachCiVec( vSupp, p, pObj, i )
        Vec_IntPush( vSuppObjs, Gia_ObjId(p, pObj) );
    Gia_ManIncrementTravId( p );
    Gia_ManCollectAnds( p, &iCoObjId, 1, vAnds, NULL );
    assert( Vec_IntSize(vAnds) > 0 );
//    pSat = Abc_NtkClpDeriveSatSolver( pCnf, iCoObjId, vSuppObjs, vAnds, vMap, &pSat1, &pSat2, &pSat3 );
    pSat = Abc_NtkClpDeriveSatSolver( pCnf, iCoObjId, vSuppObjs, vAnds, vMap, NULL, NULL, NULL );
    Vec_IntFree( vSuppObjs );
    if ( fVerbose )
        printf( "Output %4d:  Supp = %4d. Cone =%6d.\n", iCo, Vec_IntSize(vSupp), Vec_IntSize(vAnds) );
//    vSop = Bmc_CollapseOne_int3( pSat, pSat1, pSat2, pSat3, Vec_IntSize(vSupp), nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
//    vSop = Bmc_CollapseOne_int2( pSat, pSat1, Vec_IntSize(vSupp), nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
    vSop = Bmc_CollapseOne_int( pSat, Vec_IntSize(vSupp), nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
    sat_solver_delete( pSat );
    if ( pSat1 ) sat_solver_delete( pSat1 );
    if ( pSat2 ) sat_solver_delete( pSat2 );
    if ( pSat3 ) sat_solver_delete( pSat3 );
    Vec_IntFree( vAnds );
    if ( vSop == NULL )
        return NULL;
    Abc_NtkCollapseReduce( vSop, vSupp, vClass, vSupps );
    if ( fVerbose )
        printf( "Supp new = %4d. Sop = %4d.  ", Vec_IntSize(vSupp), Vec_StrSize(vSop)/(Vec_IntSize(vSupp) +3) );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vSop; 
}